

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

char * tinyformat::detail::printFormatStringLiteral(ostream *out,char *fmt)

{
  long lVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = fmt;
  do {
    if (*fmt == '%') {
      std::ostream::write((char *)out,(long)pcVar2);
      if (fmt[1] != '%') goto LAB_0010c0a3;
      fmt = fmt + 1;
      pcVar2 = fmt;
    }
    else if (*fmt == '\0') {
      std::ostream::write((char *)out,(long)pcVar2);
LAB_0010c0a3:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return fmt;
      }
      __stack_chk_fail();
    }
    fmt = fmt + 1;
  } while( true );
}

Assistant:

inline const char* printFormatStringLiteral(std::ostream& out, const char* fmt)
{
    const char* c = fmt;
    for (;; ++c) {
        if (*c == '\0') {
            out.write(fmt, c - fmt);
            return c;
        }
        else if (*c == '%') {
            out.write(fmt, c - fmt);
            if (*(c+1) != '%')
                return c;
            // for "%%", tack trailing % onto next literal section.
            fmt = ++c;
        }
    }
}